

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::SplitStringUsing
               (string *full,char *delim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  cVar1 = *delim;
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result;
  if ((cVar1 == '\0') || (delim[1] != '\0')) {
    strlen(delim);
    uVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim,0);
    if (uVar2 != 0xffffffffffffffff) {
      do {
        strlen(delim);
        uVar2 = std::__cxx11::string::find_first_of((char *)full,(ulong)delim,uVar2);
        if (uVar2 == 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)full);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_38,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == &local_58.field_2) {
            return;
          }
          operator_delete(local_58._M_dataplus._M_p);
          return;
        }
        std::__cxx11::string::substr((ulong)&local_58,(ulong)full);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_38,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        strlen(delim);
        uVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim,uVar2);
      } while (uVar2 != 0xffffffffffffffff);
    }
  }
  else if (full->_M_string_length != 0) {
    pcVar3 = (full->_M_dataplus)._M_p;
    pcVar5 = pcVar3 + full->_M_string_length;
    do {
      pcVar4 = pcVar3;
      if (*pcVar3 == cVar1) {
        pcVar4 = pcVar3 + 1;
      }
      else {
        do {
          pcVar4 = pcVar4 + 1;
          if (pcVar4 == pcVar5) break;
        } while (*pcVar4 != cVar1);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar3,pcVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_38,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      pcVar3 = pcVar4;
    } while (pcVar4 != pcVar5);
  }
  return;
}

Assistant:

void SplitStringUsing(const string& full,
                      const char* delim,
                      std::vector<string>* result) {
  std::back_insert_iterator< std::vector<string> > it(*result);
  SplitStringToIteratorUsing(full, delim, it);
}